

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ApiRowCount(Fts5Context *pCtx,i64 *pnRow)

{
  Fts5Storage *p;
  long lVar1;
  int iVar2;
  
  p = *(Fts5Storage **)(*(long *)pCtx + 0x28);
  iVar2 = fts5StorageLoadTotals(p,0);
  if (iVar2 == 0) {
    lVar1 = p->nTotalRow;
    *pnRow = lVar1;
    iVar2 = 0;
    if (lVar1 < 1) {
      iVar2 = 0x10b;
    }
  }
  return iVar2;
}

Assistant:

static int fts5ApiRowCount(Fts5Context *pCtx, i64 *pnRow){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  return sqlite3Fts5StorageRowCount(pTab->pStorage, pnRow);
}